

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

char fsnav_init_gnss_settings(fsnav_gnss *gnss)

{
  fsnav_locatecfggroup("",gnss->cfg,gnss->cfglength,&gnss->cfg_settings,&gnss->settings_length);
  *(undefined4 *)&(gnss->settings).sinEl_mask = 0;
  *(undefined4 *)((long)&(gnss->settings).sinEl_mask + 4) = 0;
  *(undefined4 *)&(gnss->settings).code_sigma = 0;
  *(undefined4 *)((long)&(gnss->settings).code_sigma + 4) = 0x40340000;
  (gnss->settings).phase_sigma = 0.01;
  (gnss->settings).doppler_sigma = 0.5;
  (gnss->settings).ant_pos[0] = 0.0;
  (gnss->settings).ant_pos[1] = 0.0;
  (gnss->settings).ant_pos[2] = 0.0;
  (gnss->settings).ant_pos_tol = -1.0;
  (gnss->settings).leap_sec_def = 0.0;
  return '\x01';
}

Assistant:

char fsnav_init_gnss_settings(fsnav_gnss* gnss)
{
	size_t i;

	fsnav_locatecfggroup("", gnss->cfg, gnss->cfglength, &(gnss->cfg_settings), &(gnss->settings_length));

	gnss->settings.sinEl_mask     = 0;
	gnss->settings.code_sigma     = 20;
	gnss->settings.phase_sigma    = 0.01;
	gnss->settings.doppler_sigma  = 0.5;
	for (i = 0; i < 3; i++)
		gnss->settings.ant_pos[i] = 0;
	gnss->settings.ant_pos_tol    = -1;
	gnss->settings.leap_sec_def   = 0;

	return 1;
}